

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

unsigned_long __thiscall
CVmObjByteArray::read_from_file
          (CVmObjByteArray *this,vm_obj_id_t self,CVmDataSource *fp,unsigned_long start_idx,
          unsigned_long len,int undo)

{
  int iVar1;
  unsigned_long uVar2;
  ulong uVar3;
  uchar *puVar4;
  ulong in_RCX;
  long *in_RDX;
  CVmObjByteArray *in_R8;
  vm_obj_id_t in_R9D;
  size_t cur_read;
  size_t chunk;
  size_t avail;
  uchar *p;
  unsigned_long total;
  unsigned_long idx;
  unsigned_long rem;
  CVmObjByteArray *in_stack_ffffffffffffff90;
  CVmObjByteArray *in_stack_ffffffffffffff98;
  CVmObjByteArray *in_stack_ffffffffffffffa0;
  unsigned_long local_50;
  unsigned_long in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  unsigned_long local_8;
  
  if (in_RCX == 0) {
    err_throw(0);
  }
  uVar2 = get_element_count((CVmObjByteArray *)0x2c7204);
  if (uVar2 < in_RCX) {
    local_8 = 0;
  }
  else if (in_R8 == (CVmObjByteArray *)0x0) {
    local_8 = 0;
  }
  else {
    uVar3 = (long)in_R8 + (in_RCX - 1);
    uVar2 = get_element_count((CVmObjByteArray *)0x2c7257);
    if (uVar2 < uVar3) {
      uVar2 = get_element_count((CVmObjByteArray *)0x2c726d);
      in_R8 = (CVmObjByteArray *)((uVar2 - in_RCX) + 1);
    }
    if (in_R9D != 0) {
      save_undo(in_R8,in_R9D,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    local_50 = 0;
    for (; in_R8 != (CVmObjByteArray *)0x0;
        in_R8 = (CVmObjByteArray *)((long)in_R8 - (long)in_stack_ffffffffffffff98)) {
      puVar4 = get_ele_ptr(in_stack_ffffffffffffffa0,(unsigned_long)in_stack_ffffffffffffff98,
                           (size_t *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffffa0;
      if (in_R8 < in_stack_ffffffffffffffa0) {
        in_stack_ffffffffffffff98 = in_R8;
      }
      iVar1 = (**(code **)(*in_RDX + 0x18))(in_RDX,puVar4,in_stack_ffffffffffffff98);
      in_stack_ffffffffffffff90 = (CVmObjByteArray *)(long)iVar1;
      local_50 = (long)&(in_stack_ffffffffffffff90->super_CVmObject)._vptr_CVmObject + local_50;
      if (in_stack_ffffffffffffff90 != in_stack_ffffffffffffff98) break;
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

unsigned long CVmObjByteArray::read_from_file(
    VMG_ vm_obj_id_t self, CVmDataSource *fp,
    unsigned long start_idx, unsigned long len, int undo)
{
    unsigned long rem;
    unsigned long idx;
    unsigned long total;

    /* make sure the starting index is at least 1 */
    if (start_idx < 1)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* 
     *   if the starting index is past the end of the array, there's nothing
     *   to do - just return success 
     */
    if (start_idx > get_element_count())
        return 0;

    /* if the requested length is zero, consider it a success */
    if (len == 0)
        return 0;

    /* 
     *   limit the request to the number of bytes available after the
     *   starting index 
     */
    if (start_idx + len - 1 > get_element_count())
        len = get_element_count() - start_idx + 1;

    /* save undo */
    if (undo)
        save_undo(vmg_ self, start_idx, len);

    /* keep going until we satisfy the request or run into a problem */
    for (idx = start_idx, rem = len, total = 0 ; rem != 0 ; )
    {
        unsigned char *p;
        size_t avail;
        size_t chunk;
        size_t cur_read;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit reading to the amount of the request remaining */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* read as much as we can of this chunk */
        cur_read = fp->readc(p, chunk);

        /* add this amount into the total so far */
        total += cur_read;

        /* 
         *   if we didn't get as much as we asked for, we must have reached
         *   the end of the file before satisfying the request - there's
         *   nothing more to be read in this case, so we can stop looping 
         */
        if (cur_read != chunk)
            break;

        /* move our counters past this chunk */
        idx += chunk;
        rem -= chunk;
    }

    /* return the total amount we read */
    return total;
}